

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool IsBIP30Repeat(CBlockIndex *block_index)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  base_blob<256U> local_98;
  base_blob<256U> local_78;
  base_blob<256U> local_58;
  base_blob<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = block_index->nHeight;
  if (iVar3 == 0x166c2) {
    CBlockIndex::GetBlockHash((uint256 *)&local_38,block_index);
    local_58.m_data._M_elems[0] = 0xec;
    local_58.m_data._M_elems[1] = 0xca;
    local_58.m_data._M_elems[2] = 0xe0;
    local_58.m_data._M_elems[3] = '\0';
    local_58.m_data._M_elems[4] = 0xe3;
    local_58.m_data._M_elems[5] = 200;
    local_58.m_data._M_elems[6] = 0xe4;
    local_58.m_data._M_elems[7] = 0xe0;
    local_58.m_data._M_elems[8] = 0x93;
    local_58.m_data._M_elems[9] = 0x93;
    local_58.m_data._M_elems[10] = 'c';
    local_58.m_data._M_elems[0xb] = '`';
    local_58.m_data._M_elems[0xc] = 'C';
    local_58.m_data._M_elems[0xd] = '\x1f';
    local_58.m_data._M_elems[0xe] = ';';
    local_58.m_data._M_elems[0xf] = 'v';
    local_58.m_data._M_elems[0x10] = '\x03';
    local_58.m_data._M_elems[0x11] = 0xc5;
    local_58.m_data._M_elems[0x12] = 'c';
    local_58.m_data._M_elems[0x13] = 0xc1;
    local_58.m_data._M_elems[0x14] = 0xff;
    local_58.m_data._M_elems[0x15] = 'a';
    local_58.m_data._M_elems[0x16] = 0x81;
    local_58.m_data._M_elems[0x17] = '9';
    local_58.m_data._M_elems[0x18] = '\n';
    local_58.m_data._M_elems[0x19] = 'M';
    local_58.m_data._M_elems[0x1a] = '\n';
    local_58.m_data._M_elems[0x1b] = '\0';
    local_58.m_data._M_elems[0x1c] = '\0';
    local_58.m_data._M_elems[0x1d] = '\0';
    local_58.m_data._M_elems[0x1e] = '\0';
    local_58.m_data._M_elems[0x1f] = '\0';
    bVar1 = operator==(&local_38,&local_58);
    bVar2 = true;
    if (bVar1) goto LAB_008b1b6b;
    iVar3 = block_index->nHeight;
  }
  if (iVar3 == 0x166e8) {
    CBlockIndex::GetBlockHash((uint256 *)&local_78,block_index);
    local_98.m_data._M_elems[0] = '!';
    local_98.m_data._M_elems[1] = 0xd7;
    local_98.m_data._M_elems[2] = '|';
    local_98.m_data._M_elems[3] = 0xcb;
    local_98.m_data._M_elems[4] = 'L';
    local_98.m_data._M_elems[5] = '\b';
    local_98.m_data._M_elems[6] = '8';
    local_98.m_data._M_elems[7] = 'j';
    local_98.m_data._M_elems[8] = '\x04';
    local_98.m_data._M_elems[9] = 0xac;
    local_98.m_data._M_elems[10] = '\x01';
    local_98.m_data._M_elems[0xb] = 0x96;
    local_98.m_data._M_elems[0xc] = 0xae;
    local_98.m_data._M_elems[0xd] = '\x10';
    local_98.m_data._M_elems[0xe] = 0xf6;
    local_98.m_data._M_elems[0xf] = 0xa1;
    local_98.m_data._M_elems[0x10] = 0xd2;
    local_98.m_data._M_elems[0x11] = 0xc2;
    local_98.m_data._M_elems[0x12] = 0xa3;
    local_98.m_data._M_elems[0x13] = 'w';
    local_98.m_data._M_elems[0x14] = 'U';
    local_98.m_data._M_elems[0x15] = 0x8c;
    local_98.m_data._M_elems[0x16] = 0xa1;
    local_98.m_data._M_elems[0x17] = 0x90;
    local_98.m_data._M_elems[0x18] = 0xf1;
    local_98.m_data._M_elems[0x19] = 'C';
    local_98.m_data._M_elems[0x1a] = '\a';
    local_98.m_data._M_elems[0x1b] = '\0';
    local_98.m_data._M_elems[0x1c] = '\0';
    local_98.m_data._M_elems[0x1d] = '\0';
    local_98.m_data._M_elems[0x1e] = '\0';
    local_98.m_data._M_elems[0x1f] = '\0';
    bVar2 = operator==(&local_78,&local_98);
  }
  else {
    bVar2 = false;
  }
LAB_008b1b6b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Repeat(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91842 && block_index.GetBlockHash() == uint256{"00000000000a4d0a398161ffc163c503763b1f4360639393e0e4c8e300e0caec"}) ||
           (block_index.nHeight==91880 && block_index.GetBlockHash() == uint256{"00000000000743f190a18c5577a3c2d2a1f610ae9601ac046a38084ccb7cd721"});
}